

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TStokesAnalytic::Sigma<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZFMatrix<Fad<double>_> *sigma)

{
  uint uVar1;
  double *pdVar2;
  Fad<double> *pFVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  Fad<double> p;
  TPZFMatrix<Fad<double>_> Du;
  TPZFMatrix<Fad<double>_> pIdentity;
  Fad<double> local_190;
  TPZVec<Fad<double>_> *local_170;
  double local_168;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_160;
  TPZFMatrix<Fad<double>_> local_150;
  TPZFMatrix<Fad<double>_> local_c0;
  
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (&local_150,(sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow,
             (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (&local_c0,(sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow,
             (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
  local_190.val_ = 0.0;
  local_190.dx_.num_elts = 0;
  local_190.dx_.ptr_to_data = (double *)0x0;
  local_190.defaultVal = 0.0;
  local_170 = x;
  Duxy<Fad<double>>(this,x,&local_150);
  if (0 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow) {
    lVar6 = 0;
    do {
      if (0 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol) {
        lVar7 = 0;
        do {
          local_168 = this->fvisco;
          if (local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar6) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar7;
          local_150.fElem[lVar4 + lVar6].val_ =
               local_150.fElem[lVar4 + lVar6].val_ * (local_168 + local_168);
          uVar1 = local_150.fElem[lVar4 + lVar6].dx_.num_elts;
          if (((ulong)uVar1 != 0) && (0 < (int)uVar1)) {
            pdVar2 = local_150.fElem[lVar4 + lVar6].dx_.ptr_to_data;
            uVar5 = 0;
            do {
              pdVar2[uVar5] = pdVar2[uVar5] * (local_168 + local_168);
              uVar5 = uVar5 + 1;
            } while (uVar1 != uVar5);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow);
  }
  pressure<Fad<double>>(this,local_170,&local_190);
  if (0 < local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow) {
    lVar6 = 0;
    do {
      pFVar3 = local_c0.fElem;
      if (local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar6) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar7 = local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar6;
      local_c0.fElem[lVar7 + lVar6].val_ = local_190.val_;
      Vector<double>::operator=(&local_c0.fElem[lVar7 + lVar6].dx_,&local_190.dx_);
      pFVar3[lVar7 + lVar6].defaultVal = local_190.defaultVal;
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow);
  }
  if (0 < (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) {
    lVar6 = 0;
    do {
      if (0 < (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol) {
        lVar7 = 0;
        do {
          if ((local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar6) ||
             (local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar7)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar6) ||
             (local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar7)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_160.fadexpr_.left_ =
               local_150.fElem +
               local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar7 + lVar6;
          local_160.fadexpr_.right_ =
               local_c0.fElem +
               local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar7 + lVar6;
          if (((sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar6) ||
             ((sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar7)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Fad<double>::operator=
                    (sigma->fElem +
                     (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * lVar7 + lVar6
                     ,&local_160);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow);
  }
  Fad<double>::~Fad(&local_190);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TStokesAnalytic::Sigma(const TPZVec<TVar> &x, TPZFMatrix<TVar> &sigma) const
{
    TPZFMatrix<TVar> Du(sigma.Rows(),sigma.Cols()), pIdentity(sigma.Rows(),sigma.Cols());
    TVar p=0.;
    Duxy(x,Du);
    for(int i=0; i<Du.Rows(); i++)
    {
        for(int j=0; j<Du.Cols(); j++)
        {
            Du(i,j) *= 2.*fvisco;
        }
    }
    pressure(x, p);
    for (int i=0; i< pIdentity.Rows(); i++) {
        pIdentity(i,i) = p;
    }
    
    for(int i=0; i<sigma.Rows(); i++)
    {
        for(int j=0; j<sigma.Cols(); j++)
        {
            sigma(i,j) = Du(i,j)-pIdentity(i,j);
        }
    }

}